

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utMaterialSystem.cpp
# Opt level: O2

void __thiscall
MaterialSystemTest_testColorProperty_Test::TestBody(MaterialSystemTest_testColorProperty_Test *this)

{
  undefined1 auVar1 [16];
  undefined4 extraout_EAX;
  int iVar2;
  char *message;
  char *expected_predicate_value;
  AssertHelper local_78;
  AssertHelper local_70;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  aiColor4D local_38;
  
  local_38.r = 2.0;
  local_38.g = 3.0;
  local_38.b = 4.0;
  local_38.a = 5.0;
  expected_predicate_value = (char *)0x0;
  aiMaterial::AddProperty((this->super_MaterialSystemTest).pcMat,&local_38,1,"testKey5",0,0);
  local_38.r = 0.0;
  local_38.g = 0.0;
  local_38.b = 1.0;
  local_38.a = 0.0;
  gtest_ar_.success_ = false;
  gtest_ar_._1_3_ = 0;
  local_78.data_._0_4_ =
       aiGetMaterialColor((this->super_MaterialSystemTest).pcMat,"testKey5",0,0,&local_38);
  testing::internal::CmpHelperEQ<aiReturn,aiReturn>
            ((internal *)&gtest_ar,"aiReturn_SUCCESS","pcMat->Get(\"testKey5\",0,0,clr)",
             (aiReturn *)&gtest_ar_,(aiReturn *)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x75,message);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  auVar1._4_4_ = -(uint)(local_38.g != 3.0);
  auVar1._0_4_ = -(uint)(local_38.r != 2.0);
  auVar1._8_4_ = -(uint)(local_38.b != 4.0);
  auVar1._12_4_ = -(uint)(local_38.a != 5.0);
  iVar2 = movmskps(extraout_EAX,auVar1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = iVar2 == 0;
  if (iVar2 != 0) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,
               (AssertionResult *)"clr.r == 2.0f && clr.g == 3.0f && clr.b == 4.0f && clr.a == 5.0f"
               ,"false","true",expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utMaterialSystem.cpp"
               ,0x76,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(MaterialSystemTest, testColorProperty)
{
    aiColor4D clr;
    clr.r = 2.0f;clr.g = 3.0f;clr.b = 4.0f;clr.a = 5.0f;
    this->pcMat->AddProperty(&clr,1,"testKey5");
    clr.b = 1.0f;
    clr.a = clr.g = clr.r = 0.0f;

    EXPECT_EQ(AI_SUCCESS, pcMat->Get("testKey5",0,0,clr));
    EXPECT_TRUE(clr.r == 2.0f && clr.g == 3.0f && clr.b == 4.0f && clr.a == 5.0f);
}